

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O1

unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
__thiscall
duckdb::Binder::BindCreateTableInfo
          (Binder *this,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *info,
          SchemaCatalogEntry *schema,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *bound_defaults)

{
  __node_base_ptr *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __node_base_ptr p_Var2;
  pointer pcVar3;
  void *pvVar4;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var5;
  optional_ptr<duckdb::Catalog,_true> oVar6;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *puVar7;
  pointer pbVar8;
  undefined1 auVar9 [8];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_01;
  bool bVar10;
  bool bVar11;
  string sVar12;
  int iVar13;
  pointer pCVar14;
  element_type *this_02;
  pointer pBVar15;
  type stmt;
  ulong uVar16;
  reference pvVar17;
  reference pvVar18;
  type pBVar19;
  reference this_03;
  pointer pCVar20;
  ForeignKeyConstraint *fk;
  ColumnList *pCVar21;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *constraints;
  undefined4 extraout_var;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var22;
  ColumnDefinition *pCVar23;
  LogicalType *pLVar24;
  string *psVar25;
  NotNullConstraint *pNVar26;
  CheckConstraint *pCVar27;
  type expr;
  UniqueConstraint *this_04;
  LogicalIndex logical;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar28;
  const_iterator cVar29;
  Catalog *pCVar30;
  pointer pBVar31;
  StatementProperties *pSVar32;
  BinderException *pBVar33;
  NotImplementedException *this_05;
  LogicalType *type;
  LogicalType *type_00;
  idx_t i;
  size_type sVar34;
  PhysicalIndex PVar35;
  pointer pbVar36;
  pointer pLVar37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  pointer pCVar38;
  size_type __n;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *this_06;
  ColumnListIterator CVar39;
  string fk_column_names;
  BoundStatement query_obj;
  optional_ptr<duckdb::CatalogEntry,_true> table_entry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  target_col_names;
  reference_set_t<SchemaCatalogEntry> fk_schemas;
  undefined1 local_3f8 [40];
  SchemaCatalogEntry *local_3d0;
  undefined1 local_3c8 [8];
  undefined1 auStack_3c0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_3a8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_390;
  undefined1 local_388 [32];
  vector<duckdb::PhysicalIndex,_true> *local_368;
  size_type *local_360;
  undefined1 local_358 [24];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_340 [8];
  float local_338;
  __node_base local_330;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_328;
  pointer local_308;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
  _Stack_300;
  pointer local_2f8;
  bool local_2f0;
  undefined1 local_2e8 [32];
  pointer local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  _Any_data local_2b8;
  __node_base local_2a8;
  code *pcStack_2a0;
  string local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  LogicalType local_210;
  LogicalType local_1f8;
  undefined1 local_1e0 [216];
  undefined1 local_108 [216];
  
  local_2c0._M_pi = in_R8;
  pCVar14 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                        *)schema);
  this_02 = (element_type *)operator_new(0x168);
  local_358._0_8_ = (schema->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry;
  (schema->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry = (_func_int **)0x0;
  local_3d0 = (SchemaCatalogEntry *)bound_defaults;
  BoundCreateTableInfo::BoundCreateTableInfo
            ((BoundCreateTableInfo *)this_02,(SchemaCatalogEntry *)bound_defaults,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             local_358);
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_02;
  if ((_Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
      local_358._0_8_ != (CreateInfo *)0x0) {
    (**(code **)(*(_func_int **)local_358._0_8_ + 8))();
  }
  pBVar15 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                          *)this);
  local_2e8._0_8_ = (CreateInfo *)0x0;
  local_2e8._8_8_ = (pointer)0x0;
  local_2e8._16_8_ = (pointer)0x0;
  if (pCVar14[1].dependencies.set._M_h._M_single_bucket == (__node_base_ptr)0x0) {
    local_2b8._M_unused._M_object = &pBVar15->dependencies;
    local_2b8._8_8_ = local_3d0;
    pcStack_2a0 = ::std::
                  _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create_table.cpp:599:28)>
                  ::_M_invoke;
    local_2a8._M_nxt =
         (_Hash_node_base *)
         ::std::
         _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create_table.cpp:599:28)>
         ::_M_manager;
    SetCatalogLookupCallback((Binder *)info,(catalog_entry_callback_t *)&local_2b8);
    if (local_2a8._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)local_2a8._M_nxt)(&local_2b8,&local_2b8,__destroy_functor);
    }
    pBVar19 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)this);
    CreateColumnDependencyManager(pBVar19);
    pBVar19 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)this);
    BindGeneratedColumns((Binder *)info,pBVar19);
    paVar1 = &pCVar14[1].catalog.field_2;
    if (pCVar14[1].dependencies.set._M_h._M_buckets !=
        *(__buckets_ptr *)((long)&pCVar14[1].sql.field_2 + 8)) {
      PVar35.index = 0;
      do {
        pCVar23 = ColumnList::GetColumnMutable((ColumnList *)paVar1,PVar35);
        pLVar24 = ColumnDefinition::Type(pCVar23);
        if (pLVar24->id_ == VARCHAR) {
          _Var5._M_head_impl =
               info[2].
               super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
               super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
               .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
          pLVar24 = ColumnDefinition::Type(pCVar23);
          StringType::GetCollation_abi_cxx11_((string *)local_358,(StringType *)pLVar24,type);
          ExpressionBinder::TestCollation((ClientContext *)_Var5._M_head_impl,(string *)local_358);
          if ((CreateInfo *)local_358._0_8_ != (CreateInfo *)(local_358 + 0x10)) {
            operator_delete((void *)local_358._0_8_);
          }
        }
        pLVar24 = ColumnDefinition::TypeMutable(pCVar23);
        pBVar15 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                  ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                                *)this);
        oVar6.ptr = (pBVar15->schema->super_InCatalogEntry).catalog;
        pBVar15 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                  ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                                *)this);
        BindLogicalType((Binder *)info,pLVar24,oVar6,
                        &(pBVar15->schema->super_InCatalogEntry).super_CatalogEntry.name);
        PVar35.index = PVar35.index + 1;
      } while (PVar35.index <
               (ulong)((long)pCVar14[1].dependencies.set._M_h._M_buckets -
                       *(long *)((long)&pCVar14[1].sql.field_2 + 8) >> 3));
    }
    local_358._8_8_ = &DAT_00000001;
    local_358._16_8_ = (pointer)0x0;
    a_Stack_340 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    [8])0x0;
    local_338 = 1.0;
    local_330._M_nxt = (_Hash_node_base *)0x0;
    _Stack_328._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_360 = &pCVar14[1].dependencies.set._M_h._M_element_count;
    local_358._0_8_ = &_Stack_328;
    if (*(size_type *)&pCVar14[1].dependencies.set._M_h._M_rehash_policy !=
        pCVar14[1].dependencies.set._M_h._M_element_count) {
      local_2e8._24_8_ = info + 0x5c;
      local_2c8 = pCVar14 + 1;
      __n = 0;
      do {
        this_03 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                                *)local_360,__n);
        pCVar20 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->(this_03);
        bVar10 = false;
        if (pCVar20->type == FOREIGN_KEY) {
          pCVar20 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_03);
          fk = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar20);
          if (((fk->info).type == FK_TYPE_FOREIGN_KEY_TABLE) &&
             (((fk->info).pk_keys.
               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_start ==
               (fk->info).pk_keys.
               super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish ||
              (bVar10 = true,
              (fk->info).fk_keys.
              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              (fk->info).fk_keys.
              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish)))) {
            FindForeignKeyIndexes((ColumnList *)paVar1,&fk->fk_columns,&(fk->info).fk_keys);
            psVar25 = &(fk->info).table;
            bVar10 = StringUtil::CIEquals((string *)local_2c8,psVar25);
            local_368 = &(fk->info).pk_keys;
            if (bVar10) {
              (fk->info).type = FK_TYPE_SELF_REFERENCE_TABLE;
              FindMatchingPrimaryKeyColumns
                        ((ColumnList *)paVar1,
                         (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                          *)local_360,fk);
              FindForeignKeyIndexes((ColumnList *)paVar1,&fk->pk_columns,local_368);
              CheckForeignKeyTypes((ColumnList *)paVar1,(ColumnList *)paVar1,fk);
              bVar10 = false;
            }
            else {
              EntryLookupInfo::EntryLookupInfo
                        ((EntryLookupInfo *)local_3c8,TABLE_ENTRY,psVar25,
                         (QueryErrorContext)0xffffffffffffffff);
              local_3f8._8_8_ = (pointer)0x0;
              local_3f8._16_8_ = local_3f8._16_8_ & 0xffffffffffffff00;
              local_3f8._0_8_ = (pointer)(local_3f8 + 0x10);
              local_390._M_head_impl =
                   (ParsedExpression *)
                   CatalogEntryRetriever::GetEntry
                             ((CatalogEntryRetriever *)local_2e8._24_8_,(string *)local_3f8,
                              &(fk->info).schema,(EntryLookupInfo *)local_3c8,THROW_EXCEPTION);
              if ((pointer)local_3f8._0_8_ != (pointer)(local_3f8 + 0x10)) {
                operator_delete((void *)local_3f8._0_8_);
              }
              optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                        ((optional_ptr<duckdb::CatalogEntry,_true> *)&local_390);
              if ((((StandardEntry *)&(local_390._M_head_impl)->super_BaseExpression)->
                  super_InCatalogEntry).super_CatalogEntry.type == VIEW_ENTRY) {
                pBVar33 = (BinderException *)__cxa_allocate_exception(0x10);
                local_3f8._0_8_ = local_3f8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3f8,"cannot reference a VIEW with a FOREIGN KEY","");
                BinderException::BinderException(pBVar33,(string *)local_3f8);
                __cxa_throw(pBVar33,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                        ((optional_ptr<duckdb::CatalogEntry,_true> *)&local_390);
              this_01._M_head_impl = local_390._M_head_impl;
              if (*(SchemaCatalogEntry **)(local_390._M_head_impl + 4) != local_3d0) {
                pBVar33 = (BinderException *)__cxa_allocate_exception(0x10);
                local_3f8._0_8_ = local_3f8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3f8,
                           "Creating foreign keys across different schemas or catalogs is not supported"
                           ,"");
                BinderException::BinderException(pBVar33,(string *)local_3f8);
                __cxa_throw(pBVar33,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              pCVar21 = TableCatalogEntry::GetColumns((TableCatalogEntry *)local_390._M_head_impl);
              constraints = TableCatalogEntry::GetConstraints
                                      ((TableCatalogEntry *)this_01._M_head_impl);
              FindMatchingPrimaryKeyColumns(pCVar21,constraints,fk);
              pCVar21 = TableCatalogEntry::GetColumns((TableCatalogEntry *)this_01._M_head_impl);
              FindForeignKeyIndexes(pCVar21,&fk->pk_columns,local_368);
              pCVar21 = TableCatalogEntry::GetColumns((TableCatalogEntry *)this_01._M_head_impl);
              CheckForeignKeyTypes(pCVar21,(ColumnList *)paVar1,fk);
              iVar13 = (*(((StandardEntry *)&(this_01._M_head_impl)->super_BaseExpression)->
                         super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                                 (this_01._M_head_impl);
              bVar10 = DataTable::HasForeignKeyIndex
                                 ((DataTable *)CONCAT44(extraout_var,iVar13),local_368,
                                  FK_TYPE_PRIMARY_KEY_TABLE);
              if (!bVar10) {
                pbVar36 = (pointer)(local_388 + 0x10);
                local_388._16_2_ = 0x2c;
                local_388._8_8_ = &DAT_00000001;
                local_388._0_8_ = pbVar36;
                StringUtil::Join((string *)local_3f8,&fk->pk_columns,(string *)local_388);
                if ((pointer)local_388._0_8_ != pbVar36) {
                  operator_delete((void *)local_388._0_8_);
                }
                pBVar33 = (BinderException *)__cxa_allocate_exception(0x10);
                local_388._0_8_ = pbVar36;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_388,
                           "Failed to create foreign key on %s(%s): no UNIQUE or PRIMARY KEY constraint present on these columns"
                           ,"");
                local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                pcVar3 = (((StandardEntry *)&(this_01._M_head_impl)->super_BaseExpression)->
                         super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_230,pcVar3,
                           pcVar3 + (((StandardEntry *)&(this_01._M_head_impl)->super_BaseExpression
                                     )->super_InCatalogEntry).super_CatalogEntry.name.
                                    _M_string_length);
                local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_250,local_3f8._0_8_,
                           (pointer)((long)&(((string *)local_3f8._8_8_)->_M_dataplus)._M_p +
                                    local_3f8._0_8_));
                BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                          (pBVar33,(string *)local_388,&local_230,&local_250);
                __cxa_throw(pBVar33,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              bVar10 = false;
            }
          }
        }
      } while ((!bVar10) &&
              (__n = __n + 1,
              __n < (ulong)((long)(*(long *)&pCVar14[1].dependencies.set._M_h._M_rehash_policy -
                                  pCVar14[1].dependencies.set._M_h._M_element_count) >> 3)));
    }
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_358);
    local_358._8_8_ = &DAT_00000001;
    local_358._16_8_ = (pointer)0x0;
    a_Stack_340 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    [8])0x0;
    local_338 = 1.0;
    local_330._M_nxt = (_Hash_node_base *)0x0;
    _Stack_328._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_358._0_8_ = &_Stack_328;
    CVar39 = ColumnList::Logical((ColumnList *)paVar1);
    _Var22._M_head_impl = (LogicalOperator *)CVar39.list;
    if (((undefined1  [16])CVar39 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      auStack_3c0._16_8_ =
           ((long)*(pointer *)&(_Var22._M_head_impl)->type -
            (long)(((vector<duckdb::ColumnDefinition,_true> *)
                   &(_Var22._M_head_impl)->_vptr_LogicalOperator)->
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>)
                  .
                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    }
    else {
      auStack_3c0._16_8_ =
           (long)((long)(((string *)&(_Var22._M_head_impl)->estimated_cardinality)->_M_dataplus).
                        _M_p -
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(_Var22._M_head_impl)->types)[1]._M_allocated_capacity) >> 3;
    }
    auStack_3c0[0] = CVar39.physical;
    auStack_3c0._8_8_ = (pointer)0x0;
    if (((undefined1  [16])CVar39 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pCVar38 = (pointer)(((long)*(pointer *)&(_Var22._M_head_impl)->type -
                           (long)(((vector<duckdb::ColumnDefinition,_true> *)
                                  &(_Var22._M_head_impl)->_vptr_LogicalOperator)->
                                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 ).
                                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x7b425ed097b425ed);
    }
    else {
      pCVar38 = (pointer)((long)((long)(((string *)&(_Var22._M_head_impl)->estimated_cardinality)->
                                       _M_dataplus)._M_p -
                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)&(_Var22._M_head_impl)->types)[1]._M_allocated_capacity) >> 3);
    }
    if (((undefined1  [16])CVar39 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pLVar37 = (pointer)(((long)*(pointer *)&(_Var22._M_head_impl)->type -
                           (long)(((vector<duckdb::ColumnDefinition,_true> *)
                                  &(_Var22._M_head_impl)->_vptr_LogicalOperator)->
                                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 ).
                                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x7b425ed097b425ed);
    }
    else {
      pLVar37 = (pointer)((long)((long)(((string *)&(_Var22._M_head_impl)->estimated_cardinality)->
                                       _M_dataplus)._M_p -
                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)&(_Var22._M_head_impl)->types)[1]._M_allocated_capacity) >> 3);
    }
    local_3c8 = (undefined1  [8])_Var22._M_head_impl;
    if ((pCVar38 != (pointer)0x0) || ((pointer)auStack_3c0._16_8_ != pLVar37)) {
      do {
        pCVar23 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                            ((ColumnLogicalIteratorInternal *)local_3c8);
        bVar10 = ColumnDefinition::Generated(pCVar23);
        if (bVar10) {
          psVar25 = ColumnDefinition::Name_abi_cxx11_(pCVar23);
          local_3f8._0_8_ = (pointer)local_358;
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_358,psVar25);
        }
        auStack_3c0._8_8_ = auStack_3c0._8_8_ + 1;
      } while ((((pointer)auStack_3c0._8_8_ != pCVar38) || ((pointer)auStack_3c0._16_8_ != pLVar37))
              || (local_3c8 != (undefined1  [8])_Var22._M_head_impl));
    }
    if (a_Stack_340 ==
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          [8])0x0) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_358);
    }
    else {
      puVar7 = *(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> **)
                &pCVar14[1].dependencies.set._M_h._M_rehash_policy;
      for (this_06 = (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                      *)pCVar14[1].dependencies.set._M_h._M_element_count;
          bVar10 = this_06 != puVar7, bVar10; this_06 = this_06 + 1) {
        pCVar20 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->(this_06);
        switch(pCVar20->type) {
        case NOT_NULL:
          pCVar20 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_06);
          pNVar26 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar20);
          pCVar23 = ColumnList::GetColumn((ColumnList *)paVar1,(LogicalIndex)(pNVar26->index).index)
          ;
          sVar12 = (string)ColumnDefinition::Generated(pCVar23);
          goto joined_r0x006f3813;
        case CHECK:
          pCVar20 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_06);
          pCVar27 = Constraint::Cast<duckdb::CheckConstraint>(pCVar20);
          local_3c8 = (undefined1  [8])((ulong)local_3c8 & 0xffffffffffffff00);
          expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator*(&pCVar27->expression);
          ExpressionContainsGeneratedColumn
                    (expr,(unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_358,(bool *)local_3c8);
          sVar12 = local_3c8[0];
joined_r0x006f3813:
          if (sVar12 != (string)0x0) goto LAB_006f388f;
          break;
        case UNIQUE:
          pCVar20 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_06);
          this_04 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar20);
          bVar11 = UniqueConstraint::HasIndex(this_04);
          if (bVar11) {
            logical = UniqueConstraint::GetIndex(this_04);
            pCVar23 = ColumnList::GetColumn((ColumnList *)paVar1,logical);
            sVar12 = (string)ColumnDefinition::Generated(pCVar23);
            goto joined_r0x006f3813;
          }
          pvVar28 = UniqueConstraint::GetColumnNames_abi_cxx11_(this_04);
          pbVar8 = (pvVar28->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar36 = (pvVar28->
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar36 != pbVar8;
              pbVar36 = pbVar36 + 1) {
            cVar29 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_358,pbVar36);
            if (cVar29.
                super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_cur != (__node_type *)0x0) goto LAB_006f388f;
          }
          break;
        case FOREIGN_KEY:
          break;
        default:
          this_05 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_3c8 = (undefined1  [8])((long)auStack_3c0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3c8,"ConstraintType not implemented","");
          NotImplementedException::NotImplementedException(this_05,(string *)local_3c8);
          __cxa_throw(this_05,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
      }
LAB_006f388f:
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_358);
      if (bVar10) {
        pBVar33 = (BinderException *)__cxa_allocate_exception(0x10);
        local_358._0_8_ = (long)local_358 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_358,"Constraints on generated columns are not supported yet","");
        BinderException::BinderException(pBVar33,(string *)local_358);
        __cxa_throw(pBVar33,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    BindNewConstraints((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                        *)local_3c8,(Binder *)info,
                       (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                        *)local_360,(string *)(pCVar14 + 1),(ColumnList *)paVar1);
    local_358._16_8_ = local_2e8._16_8_;
    local_358._8_8_ = local_2e8._8_8_;
    local_358._0_8_ = local_2e8._0_8_;
    local_2e8._0_8_ = local_3c8;
    local_2e8._8_8_ = auStack_3c0._0_8_;
    local_2e8._16_8_ = auStack_3c0._8_8_;
    local_3c8 = (undefined1  [8])0x0;
    auStack_3c0._0_8_ = (string *)0x0;
    auStack_3c0._8_8_ = (BoundAtClause *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)local_358);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)local_3c8);
    pCVar30 = (Catalog *)
              (**(code **)((long)(((_Vector_impl *)
                                  &(local_3d0->super_InCatalogEntry).super_CatalogEntry.
                                   _vptr_CatalogEntry)->super__Vector_impl_data)._M_start + 0x58))()
    ;
    psVar25 = Catalog::GetName_abi_cxx11_(pCVar30);
    BindDefaultValues((Binder *)info,(ColumnList *)paVar1,
                      (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       *)local_2c0._M_pi,psVar25,
                      &(local_3d0->super_InCatalogEntry).super_CatalogEntry.name);
  }
  else {
    this_00 = &pCVar14[1].dependencies.set._M_h._M_single_bucket;
    stmt = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator*((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                      *)this_00);
    Bind((BoundStatement *)local_3c8,(Binder *)info,stmt);
    p_Var2 = *this_00;
    *this_00 = (__node_base_ptr)0x0;
    if (p_Var2 != (__node_base_ptr)0x0) {
      (*(code *)p_Var2->_M_nxt[1]._M_nxt)();
    }
    pBVar15 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                            *)this);
    auVar9 = local_3c8;
    local_3c8 = (undefined1  [8])0x0;
    _Var22._M_head_impl =
         (pBVar15->query).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pBVar15->query).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)auVar9;
    if (_Var22._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var22._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    paVar1 = &pCVar14[1].catalog.field_2;
    ColumnList::GetColumnNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_388,(ColumnList *)paVar1);
    *(undefined1 *)&pCVar14[1].dependencies.set._M_h._M_before_begin._M_nxt = 1;
    if (local_388._0_8_ == local_388._8_8_) {
      if (local_3a8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_3a8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar34 = 0;
        do {
          pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&local_3a8,sVar34);
          pcVar3 = (pvVar17->_M_dataplus)._M_p;
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_290,pcVar3,pcVar3 + pvVar17->_M_string_length);
          pvVar18 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)auStack_3c0,sVar34);
          LogicalType::LogicalType(&local_210,pvVar18);
          ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_1e0,&local_290,&local_210);
          ColumnList::AddColumn((ColumnList *)paVar1,(ColumnDefinition *)local_1e0);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(local_1e0 + 0xa0));
          Value::~Value((Value *)(local_1e0 + 0x60));
          if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               )local_1e0._88_8_ != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)local_1e0._88_8_ + 8))();
          }
          local_1e0._88_8_ =
               (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                )0x0;
          LogicalType::~LogicalType((LogicalType *)(local_1e0 + 0x20));
          if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
            operator_delete((void *)local_1e0._0_8_);
          }
          LogicalType::~LogicalType(&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p);
          }
          sVar34 = sVar34 + 1;
        } while (sVar34 < (ulong)((long)local_3a8.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_3a8.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
    }
    else {
      sVar34 = (long)(local_388._8_8_ - local_388._0_8_) >> 5;
      uVar16 = ((long)(auStack_3c0._8_8_ - auStack_3c0._0_8_) >> 3) * -0x5555555555555555;
      if (uVar16 < sVar34) {
        pBVar33 = (BinderException *)__cxa_allocate_exception(0x10);
        local_358._0_8_ = (long)local_358 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_358,"Target table has more colum names than query result.","");
        BinderException::BinderException(pBVar33,(string *)local_358);
        __cxa_throw(pBVar33,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((sVar34 < uVar16) &&
         (sVar34 < (ulong)(((long)(auStack_3c0._8_8_ - auStack_3c0._0_8_) >> 3) *
                          -0x5555555555555555))) {
        do {
          pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&local_3a8,sVar34);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_388,pvVar17);
          sVar34 = sVar34 + 1;
        } while (sVar34 < (ulong)(((long)(auStack_3c0._8_8_ - auStack_3c0._0_8_) >> 3) *
                                 -0x5555555555555555));
      }
      ColumnList::ColumnList((ColumnList *)local_358,false);
      if (local_388._8_8_ != local_388._0_8_) {
        sVar34 = 0;
        do {
          pvVar17 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)local_388,sVar34);
          pcVar3 = (pvVar17->_M_dataplus)._M_p;
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_270,pcVar3,pcVar3 + pvVar17->_M_string_length);
          pvVar18 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)auStack_3c0,sVar34);
          LogicalType::LogicalType(&local_1f8,pvVar18);
          ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_108,&local_270,&local_1f8);
          ColumnList::AddColumn((ColumnList *)local_358,(ColumnDefinition *)local_108);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(local_108 + 0xa0));
          Value::~Value((Value *)(local_108 + 0x60));
          if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               )local_108._88_8_ != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)local_108._88_8_ + 8))();
          }
          local_108._88_8_ =
               (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                )0x0;
          LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_);
          }
          LogicalType::~LogicalType(&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p);
          }
          sVar34 = sVar34 + 1;
        } while (sVar34 < (ulong)((long)(local_388._8_8_ - local_388._0_8_) >> 5));
      }
      local_3f8._0_8_ = pCVar14[1].catalog.field_2._M_allocated_capacity;
      local_3f8._8_8_ = *(long *)((long)&pCVar14[1].catalog.field_2 + 8);
      local_3f8._16_8_ = pCVar14[1].schema._M_dataplus._M_p;
      pCVar14[1].catalog.field_2._M_allocated_capacity = local_358._0_8_;
      *(undefined8 *)((long)&pCVar14[1].catalog.field_2 + 8) = local_358._8_8_;
      pCVar14[1].schema._M_dataplus._M_p = (pointer)local_358._16_8_;
      local_358._0_8_ =
           (__uniq_ptr_data<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true,_true>
           )0x0;
      local_358._8_8_ = (pointer)0x0;
      local_358._16_8_ = (pointer)0x0;
      ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
                ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)
                 local_3f8);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)&pCVar14[1].schema._M_string_length,a_Stack_340);
      pvVar4 = *(void **)((long)&pCVar14[1].sql.field_2 + 8);
      *(pointer *)((long)&pCVar14[1].sql.field_2 + 8) = local_308;
      pCVar14[1].dependencies.set._M_h._M_buckets =
           (__buckets_ptr)
           _Stack_300._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      pCVar14[1].dependencies.set._M_h._M_bucket_count = (size_type)local_2f8;
      local_308 = (pointer)0x0;
      _Stack_300._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
      local_2f8 = (pointer)0x0;
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4);
      }
      *(bool *)&pCVar14[1].dependencies.set._M_h._M_before_begin._M_nxt = local_2f0;
      if (local_308 != (pointer)0x0) {
        operator_delete(local_308);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(a_Stack_340);
      ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
                ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)
                 local_358);
    }
    if (pCVar14[1].dependencies.set._M_h._M_buckets !=
        *(__buckets_ptr *)((long)&pCVar14[1].sql.field_2 + 8)) {
      PVar35.index = 0;
      do {
        pCVar23 = ColumnList::GetColumnMutable((ColumnList *)paVar1,PVar35);
        pLVar24 = ColumnDefinition::Type(pCVar23);
        if (pLVar24->id_ == VARCHAR) {
          _Var5._M_head_impl =
               info[2].
               super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
               super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
               .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
          pLVar24 = ColumnDefinition::Type(pCVar23);
          StringType::GetCollation_abi_cxx11_((string *)local_358,(StringType *)pLVar24,type_00);
          ExpressionBinder::TestCollation((ClientContext *)_Var5._M_head_impl,(string *)local_358);
          if ((CreateInfo *)local_358._0_8_ != (CreateInfo *)(local_358 + 0x10)) {
            operator_delete((void *)local_358._0_8_);
          }
        }
        pLVar24 = ColumnDefinition::TypeMutable(pCVar23);
        pBVar15 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                  ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                                *)this);
        oVar6.ptr = (pBVar15->schema->super_InCatalogEntry).catalog;
        pBVar15 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                  ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                                *)this);
        BindLogicalType((Binder *)info,pLVar24,oVar6,
                        &(pBVar15->schema->super_InCatalogEntry).super_CatalogEntry.name);
        PVar35.index = PVar35.index + 1;
      } while (PVar35.index <
               (ulong)((long)pCVar14[1].dependencies.set._M_h._M_buckets -
                       *(long *)((long)&pCVar14[1].sql.field_2 + 8) >> 3));
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_388);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_3a8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)auStack_3c0);
    if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
        local_3c8 != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_3c8 + 8))();
    }
  }
  if (pCVar14[1].dependencies.set._M_h._M_buckets ==
      *(__buckets_ptr *)((long)&pCVar14[1].sql.field_2 + 8)) {
    pBVar33 = (BinderException *)__cxa_allocate_exception(0x10);
    local_358._0_8_ = (long)local_358 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "Creating a table without physical (non-generated) columns is not supported","");
    BinderException::BinderException(pBVar33,(string *)local_358);
    __cxa_throw(pBVar33,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar15 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                          *)this);
  pCVar30 = (local_3d0->super_InCatalogEntry).catalog;
  pBVar31 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                          *)this);
  pCVar14 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->(&pBVar31->base);
  LogicalDependencyList::VerifyDependencies(&pBVar15->dependencies,pCVar30,(string *)(pCVar14 + 1));
  pSVar32 = GetStatementProperties((Binder *)info);
  pSVar32->allow_stream_result = false;
  ::std::
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
             *)local_2e8);
  return (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          )(unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
            )this;
}

Assistant:

unique_ptr<BoundCreateTableInfo> Binder::BindCreateTableInfo(unique_ptr<CreateInfo> info, SchemaCatalogEntry &schema,
                                                             vector<unique_ptr<Expression>> &bound_defaults) {
	auto &base = info->Cast<CreateTableInfo>();
	auto result = make_uniq<BoundCreateTableInfo>(schema, std::move(info));
	auto &dependencies = result->dependencies;

	vector<unique_ptr<BoundConstraint>> bound_constraints;
	if (base.query) {
		// construct the result object
		auto query_obj = Bind(*base.query);
		base.query.reset();
		result->query = std::move(query_obj.plan);

		// construct the set of columns based on the names and types of the query
		auto &names = query_obj.names;
		auto &sql_types = query_obj.types;
		// e.g. create table (col1 ,col2) as QUERY
		// col1 and col2 are the target_col_names
		auto target_col_names = base.columns.GetColumnNames();
		// TODO check  types and target_col_names are mismatch in size
		D_ASSERT(names.size() == sql_types.size());
		base.columns.SetAllowDuplicates(true);
		if (!target_col_names.empty()) {
			if (target_col_names.size() > sql_types.size()) {
				throw BinderException("Target table has more colum names than query result.");
			} else if (target_col_names.size() < sql_types.size()) {
				// filled the target_col_names with the name of query names
				for (idx_t i = target_col_names.size(); i < sql_types.size(); i++) {
					target_col_names.push_back(names[i]);
				}
			}
			ColumnList new_colums;
			for (idx_t i = 0; i < target_col_names.size(); i++) {
				new_colums.AddColumn(ColumnDefinition(target_col_names[i], sql_types[i]));
			}
			base.columns = std::move(new_colums);
		} else {
			for (idx_t i = 0; i < names.size(); i++) {
				base.columns.AddColumn(ColumnDefinition(names[i], sql_types[i]));
			}
		}
		// bind collations to detect any unsupported collation errors
		for (idx_t i = 0; i < base.columns.PhysicalColumnCount(); i++) {
			auto &column = base.columns.GetColumnMutable(PhysicalIndex(i));
			if (column.Type().id() == LogicalTypeId::VARCHAR) {
				ExpressionBinder::TestCollation(context, StringType::GetCollation(column.Type()));
			}
			BindLogicalType(column.TypeMutable(), &result->schema.catalog, result->schema.name);
		}
	} else {
		SetCatalogLookupCallback([&dependencies, &schema](CatalogEntry &entry) {
			if (&schema.ParentCatalog() != &entry.ParentCatalog()) {
				// Don't register dependencies between catalogs
				return;
			}
			dependencies.AddDependency(entry);
		});
		CreateColumnDependencyManager(*result);
		// bind the generated column expressions
		BindGeneratedColumns(*result);
		// bind any constraints

		// bind collations to detect any unsupported collation errors
		for (idx_t i = 0; i < base.columns.PhysicalColumnCount(); i++) {
			auto &column = base.columns.GetColumnMutable(PhysicalIndex(i));
			if (column.Type().id() == LogicalTypeId::VARCHAR) {
				ExpressionBinder::TestCollation(context, StringType::GetCollation(column.Type()));
			}
			BindLogicalType(column.TypeMutable(), &result->schema.catalog, result->schema.name);
		}
		BindCreateTableConstraints(base, entry_retriever, schema);

		if (AnyConstraintReferencesGeneratedColumn(base)) {
			throw BinderException("Constraints on generated columns are not supported yet");
		}
		bound_constraints = BindNewConstraints(base.constraints, base.table, base.columns);
		// bind the default values
		auto &catalog_name = schema.ParentCatalog().GetName();
		auto &schema_name = schema.name;
		BindDefaultValues(base.columns, bound_defaults, catalog_name, schema_name);
	}

	if (base.columns.PhysicalColumnCount() == 0) {
		throw BinderException("Creating a table without physical (non-generated) columns is not supported");
	}

	result->dependencies.VerifyDependencies(schema.catalog, result->Base().table);

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	return result;
}